

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void * prepend_alloc(mstate m,char *newbase,char *oldbase,size_t nb)

{
  size_t sVar1;
  ulong uVar2;
  malloc_tree_chunk *pmVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  tbinptr pmVar7;
  char *pcVar8;
  malloc_tree_chunk *pmVar9;
  size_t *psVar10;
  byte bVar11;
  bool bVar12;
  ulong local_140;
  ulong local_130;
  tchunkptr F_3;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I_2;
  tbinptr *H_1;
  tchunkptr TP_1;
  mchunkptr F_2;
  mchunkptr B_1;
  bindex_t I_1;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F_1;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr TP;
  bindex_t I;
  mchunkptr B;
  mchunkptr F;
  size_t nsize;
  size_t dsize;
  size_t tsize;
  size_t qsize;
  mchunkptr q;
  size_t psize;
  mchunkptr oldfirst;
  mchunkptr p;
  size_t nb_local;
  char *oldbase_local;
  char *newbase_local;
  mstate m_local;
  
  if (((ulong)(newbase + 0x10) & 0xf) == 0) {
    local_130 = 0;
  }
  else {
    local_130 = 0x10 - ((ulong)(newbase + 0x10) & 0xf) & 0xf;
  }
  pcVar6 = newbase + local_130;
  if (((ulong)(oldbase + 0x10) & 0xf) == 0) {
    local_140 = 0;
  }
  else {
    local_140 = 0x10 - ((ulong)(oldbase + 0x10) & 0xf) & 0xf;
  }
  psize = (size_t)(oldbase + local_140);
  pmVar7 = (tbinptr)(pcVar6 + nb);
  tsize = psize + (-nb - (long)pcVar6);
  *(size_t *)(pcVar6 + 8) = nb | 3;
  if ((tbinptr)psize == (tbinptr)m->top) {
    sVar1 = m->topsize;
    m->topsize = tsize + sVar1;
    m->top = (mchunkptr)pmVar7;
    pmVar7->head = (ulong)(tsize + sVar1) | 1;
    goto LAB_00171978;
  }
  if ((tbinptr)psize == (tbinptr)m->dv) {
    pcVar8 = (char *)(tsize + m->dvsize);
    m->dvsize = (size_t)pcVar8;
    m->dv = (mchunkptr)pmVar7;
    pmVar7->head = (ulong)pcVar8 | 1;
    *(char **)(pcVar8 + (long)(pmVar7->child + -4)) = pcVar8;
    goto LAB_00171978;
  }
  if ((((tbinptr)psize)->head & 3) == 1) {
    uVar2 = ((tbinptr)psize)->head;
    if (uVar2 >> 3 < 0x20) {
      pmVar9 = ((tbinptr)psize)->fd;
      pmVar3 = ((tbinptr)psize)->bk;
      iVar4 = (int)(uVar2 >> 3);
      bVar12 = true;
      if ((pmVar9 != (malloc_tree_chunk *)(m->smallbins + (uint)(iVar4 << 1))) &&
         (bVar12 = false, (malloc_tree_chunk *)m->least_addr <= pmVar9)) {
        bVar12 = pmVar9->bk == (tbinptr)psize;
      }
      if (!bVar12) {
        abort();
      }
      if (pmVar3 == pmVar9) {
        m->smallmap = (1 << ((byte)(uVar2 >> 3) & 0x1f) ^ 0xffffffffU) & m->smallmap;
      }
      else {
        bVar12 = true;
        if ((pmVar3 != (malloc_tree_chunk *)(m->smallbins + (uint)(iVar4 << 1))) &&
           (bVar12 = false, (malloc_tree_chunk *)m->least_addr <= pmVar3)) {
          bVar12 = pmVar3->fd == (tbinptr)psize;
        }
        if (!bVar12) {
          abort();
        }
        pmVar9->bk = pmVar3;
        pmVar3->fd = pmVar9;
      }
    }
    else {
      pmVar9 = ((tbinptr)psize)->parent;
      if (((tbinptr)psize)->bk == (tbinptr)psize) {
        CP = ((tbinptr)psize)->child + 1;
        F_1 = ((tbinptr)psize)->child[1];
        if (F_1 == (malloc_tree_chunk *)0x0) {
          CP = ((tbinptr)psize)->child;
          F_1 = ((tbinptr)psize)->child[0];
          if (F_1 == (malloc_tree_chunk *)0x0) goto LAB_001712f5;
        }
        while( true ) {
          H = F_1->child + 1;
          bVar12 = true;
          if (F_1->child[1] == (malloc_tree_chunk *)0x0) {
            H = F_1->child;
            bVar12 = F_1->child[0] != (malloc_tree_chunk *)0x0;
          }
          if (!bVar12) break;
          CP = H;
          F_1 = *H;
        }
        if (CP < m->least_addr) {
          abort();
        }
        *CP = (tchunkptr)0x0;
      }
      else {
        pmVar3 = ((tbinptr)psize)->fd;
        F_1 = ((tbinptr)psize)->bk;
        bVar12 = false;
        if (((malloc_tree_chunk *)m->least_addr <= pmVar3) &&
           (bVar12 = false, pmVar3->bk == (tbinptr)psize)) {
          bVar12 = F_1->fd == (tbinptr)psize;
        }
        if (!bVar12) {
          abort();
        }
        pmVar3->bk = F_1;
        F_1->fd = pmVar3;
      }
LAB_001712f5:
      if (pmVar9 != (malloc_tree_chunk *)0x0) {
        if ((tbinptr)psize == m->treebins[((tbinptr)psize)->index]) {
          m->treebins[((tbinptr)psize)->index] = F_1;
          if (F_1 == (tchunkptr)0x0) {
            m->treemap = (1 << ((byte)((tbinptr)psize)->index & 0x1f) ^ 0xffffffffU) & m->treemap;
          }
        }
        else {
          if (pmVar9 < (malloc_tree_chunk *)m->least_addr) {
            abort();
          }
          if (pmVar9->child[0] == (tbinptr)psize) {
            pmVar9->child[0] = F_1;
          }
          else {
            pmVar9->child[1] = F_1;
          }
        }
        if (F_1 != (tchunkptr)0x0) {
          if (F_1 < (tchunkptr)m->least_addr) {
            abort();
          }
          F_1->parent = pmVar9;
          pmVar9 = ((tbinptr)psize)->child[0];
          if (pmVar9 != (malloc_tree_chunk *)0x0) {
            if (pmVar9 < (malloc_tree_chunk *)m->least_addr) {
              abort();
            }
            F_1->child[0] = pmVar9;
            pmVar9->parent = F_1;
          }
          pmVar9 = ((tbinptr)psize)->child[1];
          if (pmVar9 != (malloc_tree_chunk *)0x0) {
            if (pmVar9 < (malloc_tree_chunk *)m->least_addr) {
              abort();
            }
            F_1->child[1] = pmVar9;
            pmVar9->parent = F_1;
          }
        }
      }
    }
    psize = (long)((tbinptr)psize)->child + ((uVar2 & 0xfffffffffffffff8) - 0x20);
    tsize = tsize + (uVar2 & 0xfffffffffffffff8);
  }
  *(ulong *)(psize + 8) = *(ulong *)(psize + 8) & 0xfffffffffffffffe;
  pmVar7->head = tsize | 1;
  *(size_t *)((long)pmVar7->child + (tsize - 0x20)) = tsize;
  if (tsize >> 3 < 0x20) {
    pmVar9 = (malloc_tree_chunk *)(m->smallbins + (uint)((int)(tsize >> 3) << 1));
    bVar11 = (byte)(tsize >> 3);
    if ((m->smallmap & 1 << (bVar11 & 0x1f)) == 0) {
      m->smallmap = 1 << (bVar11 & 0x1f) | m->smallmap;
      TP_1 = pmVar9;
    }
    else {
      if (pmVar9->fd < (malloc_tree_chunk *)m->least_addr) {
        abort();
      }
      TP_1 = pmVar9->fd;
    }
    pmVar9->fd = pmVar7;
    TP_1->bk = pmVar7;
    pmVar7->fd = TP_1;
    pmVar7->bk = pmVar9;
  }
  else {
    uVar5 = (uint)(tsize >> 8);
    if (uVar5 == 0) {
      K = 0;
    }
    else if (uVar5 < 0x10000) {
      K = (0x1f - LZCOUNT(uVar5)) * 2 +
          ((uint)(tsize >> ((char)(0x1f - LZCOUNT(uVar5)) + 7U & 0x3f)) & 1);
    }
    else {
      K = 0x1f;
    }
    pmVar9 = (malloc_tree_chunk *)(m->treebins + K);
    pmVar7->index = K;
    pmVar7->child[1] = (malloc_tree_chunk *)0x0;
    pmVar7->child[0] = (malloc_tree_chunk *)0x0;
    if ((m->treemap & 1 << ((byte)K & 0x1f)) == 0) {
      m->treemap = 1 << ((byte)K & 0x1f) | m->treemap;
      pmVar9->prev_foot = (size_t)pmVar7;
      pmVar7->parent = pmVar9;
      pmVar7->bk = pmVar7;
      pmVar7->fd = pmVar7;
    }
    else {
      K_1 = pmVar9->prev_foot;
      if (K == 0x1f) {
        bVar11 = 0;
      }
      else {
        bVar11 = 0x3f - ((char)(K >> 1) + '\x06');
      }
      C = (tchunkptr *)(tsize << (bVar11 & 0x3f));
      while ((*(ulong *)(K_1 + 8) & 0xfffffffffffffff8) != tsize) {
        psVar10 = (size_t *)(K_1 + 0x20 + ((long)C >> 0x3f) * -8);
        C = (tchunkptr *)((long)C << 1);
        if (*psVar10 == 0) {
          if (psVar10 < m->least_addr) {
            abort();
          }
          *psVar10 = (size_t)pmVar7;
          pmVar7->parent = (malloc_tree_chunk *)K_1;
          pmVar7->bk = pmVar7;
          pmVar7->fd = pmVar7;
          goto LAB_00171978;
        }
        K_1 = *psVar10;
      }
      pmVar9 = *(malloc_tree_chunk **)(K_1 + 0x10);
      bVar12 = false;
      if (m->least_addr <= K_1) {
        bVar12 = (malloc_tree_chunk *)m->least_addr <= pmVar9;
      }
      if (!bVar12) {
        abort();
      }
      pmVar9->bk = pmVar7;
      *(tbinptr *)(K_1 + 0x10) = pmVar7;
      pmVar7->fd = pmVar9;
      pmVar7->bk = (malloc_tree_chunk *)K_1;
      pmVar7->parent = (malloc_tree_chunk *)0x0;
    }
  }
LAB_00171978:
  return pcVar6 + 0x10;
}

Assistant:

static void* prepend_alloc(mstate m, char* newbase, char* oldbase,
                           size_t nb) {
  mchunkptr p = align_as_chunk(newbase);
  mchunkptr oldfirst = align_as_chunk(oldbase);
  size_t psize = (char*)oldfirst - (char*)p;
  mchunkptr q = chunk_plus_offset(p, nb);
  size_t qsize = psize - nb;
  set_size_and_pinuse_of_inuse_chunk(m, p, nb);

  assert((char*)oldfirst > (char*)q);
  assert(pinuse(oldfirst));
  assert(qsize >= MIN_CHUNK_SIZE);

  /* consolidate remainder with first chunk of old base */
  if (oldfirst == m->top) {
    size_t tsize = m->topsize += qsize;
    m->top = q;
    q->head = tsize | PINUSE_BIT;
    check_top_chunk(m, q);
  }
  else if (oldfirst == m->dv) {
    size_t dsize = m->dvsize += qsize;
    m->dv = q;
    set_size_and_pinuse_of_free_chunk(q, dsize);
  }
  else {
    if (!is_inuse(oldfirst)) {
      size_t nsize = chunksize(oldfirst);
      unlink_chunk(m, oldfirst, nsize);
      oldfirst = chunk_plus_offset(oldfirst, nsize);
      qsize += nsize;
    }
    set_free_with_pinuse(q, qsize, oldfirst);
    insert_chunk(m, q, qsize);
    check_free_chunk(m, q);
  }

  check_malloced_chunk(m, chunk2mem(p), nb);
  return chunk2mem(p);
}